

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O0

int __thiscall
libtorrent::aux::
bencode_visitor<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator()(bencode_visitor<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,integer_type i)

{
  int iVar1;
  int ret;
  integer_type i_local;
  bencode_visitor<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  write_char<std::back_insert_iterator<std::__cxx11::string>>(this->out,'i');
  iVar1 = write_integer<std::back_insert_iterator<std::__cxx11::string>,long,void>(this->out,i);
  write_char<std::back_insert_iterator<std::__cxx11::string>>(this->out,'e');
  return iVar1 + 2;
}

Assistant:

int operator()(entry::integer_type i)
		{
			write_char(out, 'i');
			int const ret = write_integer(out, i);
			write_char(out, 'e');
			return ret + 2;
		}